

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

int deqp::gles3::Functional::anon_unknown_0::compareImages
              (TestLog *log,ConstPixelBufferAccess *test,ConstPixelBufferAccess *ref,
              PixelBufferAccess *diffMask,int kernelRadius,_func_bool_IVec4_ptr_IVec4_ptr *pixelCmp)

{
  _func_bool_IVec4_ptr_IVec4_ptr *p_Var1;
  bool bVar2;
  MessageBuilder *pMVar3;
  int local_404;
  MessageBuilder local_3c0;
  MessageBuilder local_230;
  undefined1 local_ac [24];
  int kX_1;
  int kY_1;
  int local_84;
  int local_80;
  int kX;
  int kY;
  undefined1 local_74 [2];
  bool foundTest;
  bool foundRef;
  int radius;
  IVec4 cTest;
  IVec4 cRef;
  int x;
  int y;
  int compareFailed;
  int faultyPixels;
  int deviatingPixels;
  int width;
  int height;
  _func_bool_IVec4_ptr_IVec4_ptr *pixelCmp_local;
  PixelBufferAccess *pPStack_28;
  int kernelRadius_local;
  PixelBufferAccess *diffMask_local;
  ConstPixelBufferAccess *ref_local;
  ConstPixelBufferAccess *test_local;
  TestLog *log_local;
  
  _width = pixelCmp;
  pixelCmp_local._4_4_ = kernelRadius;
  pPStack_28 = diffMask;
  diffMask_local = (PixelBufferAccess *)ref;
  ref_local = test;
  test_local = (ConstPixelBufferAccess *)log;
  deviatingPixels = tcu::ConstPixelBufferAccess::getHeight(test);
  faultyPixels = tcu::ConstPixelBufferAccess::getWidth(ref_local);
  compareFailed = 0;
  y = 0;
  x = -1;
  tcu::clear(pPStack_28,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK);
  cRef.m_data[3] = 0;
  do {
    if (deviatingPixels <= cRef.m_data[3]) {
      tcu::TestLog::operator<<
                (&local_230,(TestLog *)test_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_230,&compareFailed);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])" deviating pixel(s) found.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_230);
      tcu::TestLog::operator<<
                (&local_3c0,(TestLog *)test_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_3c0,&y);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])" faulty pixel(s) found.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3c0);
      if (x == 1) {
        local_404 = y;
      }
      else {
        local_404 = x;
      }
      return local_404;
    }
    for (cRef.m_data[2] = 0; cRef.m_data[2] < faultyPixels; cRef.m_data[2] = cRef.m_data[2] + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)(cTest.m_data + 2),(int)diffMask_local,cRef.m_data[2],
                 cRef.m_data[3]);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_74,(int)ref_local,cRef.m_data[2],cRef.m_data[3]);
      bVar2 = (*_width)((IVec4 *)(cTest.m_data + 2),(IVec4 *)local_74);
      if (!bVar2) {
        kY = pixelCmp_local._4_4_;
        kX._3_1_ = 0;
        kX._2_1_ = 0;
        if ((((cRef.m_data[3] < pixelCmp_local._4_4_) || (cRef.m_data[2] < pixelCmp_local._4_4_)) ||
            (deviatingPixels <= cRef.m_data[3] + pixelCmp_local._4_4_)) ||
           (faultyPixels <= cRef.m_data[2] + pixelCmp_local._4_4_)) {
          kX._3_1_ = 1;
          kX._2_1_ = 1;
        }
        else {
          for (local_80 = cRef.m_data[3] - pixelCmp_local._4_4_; local_80 <= cRef.m_data[3] + kY;
              local_80 = local_80 + 1) {
            for (local_84 = cRef.m_data[2] - kY; p_Var1 = _width, local_84 <= cRef.m_data[2] + kY;
                local_84 = local_84 + 1) {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&kX_1,(int)ref_local,local_84,local_80);
              bVar2 = (*p_Var1)((IVec4 *)(cTest.m_data + 2),(IVec4 *)&kX_1);
              if (bVar2) {
                kX._3_1_ = 1;
                break;
              }
            }
          }
          for (local_ac._20_4_ = cRef.m_data[3] - kY; (int)local_ac._20_4_ <= cRef.m_data[3] + kY;
              local_ac._20_4_ = local_ac._20_4_ + 1) {
            for (local_ac._16_4_ = cRef.m_data[2] - kY; p_Var1 = _width,
                (int)local_ac._16_4_ <= cRef.m_data[2] + kY; local_ac._16_4_ = local_ac._16_4_ + 1)
            {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_ac,(int)diffMask_local,local_ac._16_4_,
                         local_ac._20_4_);
              bVar2 = (*p_Var1)((IVec4 *)local_74,(IVec4 *)local_ac);
              if (bVar2) {
                kX._2_1_ = 1;
                break;
              }
            }
          }
        }
        if (((kX._3_1_ & 1) == 0) || ((kX._2_1_ & 1) == 0)) {
          tcu::PixelBufferAccess::setPixel
                    (pPStack_28,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,
                     cRef.m_data[2],cRef.m_data[3],0);
          y = y + 1;
          x = 1;
        }
        else {
          tcu::PixelBufferAccess::setPixel
                    (pPStack_28,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_DEV,
                     cRef.m_data[2],cRef.m_data[3],0);
          if (x == -1) {
            x = 0;
          }
          compareFailed = compareFailed + 1;
        }
      }
    }
    cRef.m_data[3] = cRef.m_data[3] + 1;
  } while( true );
}

Assistant:

inline int compareImages (tcu::TestLog& log, const ConstPixelBufferAccess& test, const ConstPixelBufferAccess& ref, const PixelBufferAccess& diffMask, int kernelRadius, bool (*pixelCmp)(const tcu::IVec4& a, const tcu::IVec4& b))
{
	const int			height				= test.getHeight();
	const int			width				= test.getWidth();
	int					deviatingPixels		= 0;
	int					faultyPixels		= 0;
	int					compareFailed		= -1;

	tcu::clear(diffMask, MASK_COLOR_OK);

	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const tcu::IVec4 cRef	= ref.getPixelInt(x, y);
			const tcu::IVec4 cTest	= test.getPixelInt(x, y);

			// Pixelwise match, no deviation or fault
			if ((*pixelCmp)(cRef, cTest))
				continue;

			// Deviation
			{
				const int radius	= kernelRadius;
				bool foundRef		= false;
				bool foundTest		= false;

				// edges are considered a "deviation" too. The suitable pixel could be "behind" the edge
				if (y < radius || x < radius || y + radius >= height || x + radius >= width)
				{
					foundRef	= true;
					foundTest	= true;
				}
				else
				{
					// find ref
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cRef, test.getPixelInt(kX, kY)))
						{
							foundRef = true;
							break;
						}
					}

					// find result
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cTest, ref.getPixelInt(kX, kY)))
						{
							foundTest = true;
							break;
						}
					}
				}

				// A pixel is deviating if the reference color is found inside the kernel and (~= every pixel reference draws must be drawn by the gl too)
				// the result color is found in the reference image inside the kernel         (~= every pixel gl draws must be drawn by the reference too)
				if (foundRef && foundTest)
				{
					diffMask.setPixel(MASK_COLOR_DEV, x, y);
					if (compareFailed == -1)
						compareFailed = 0;
					deviatingPixels++;
					continue;
				}
			}

			diffMask.setPixel(MASK_COLOR_FAIL, x, y);
			faultyPixels++;									// The pixel is faulty if the color is not found
			compareFailed = 1;
		}
	}

	log << TestLog::Message << deviatingPixels	<< " deviating pixel(s) found." << TestLog::EndMessage;
	log << TestLog::Message << faultyPixels		<< " faulty pixel(s) found." << TestLog::EndMessage;

	return (compareFailed == 1 ? faultyPixels : compareFailed);
}